

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O0

void linker_mapfile(GlobalVars *gv)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  long in_RDI;
  char sep;
  LinkFile *lfile;
  LinkedSection *ls;
  Section *sec;
  ObjectUnit *obj;
  undefined7 in_stack_ffffffffffffffd0;
  char in_stack_ffffffffffffffd7;
  long *local_20;
  long *local_18;
  long *local_10;
  
  if (*(long *)(in_RDI + 0xa8) != 0) {
    fprintf(*(FILE **)(in_RDI + 0xa8),"\nFiles:\n");
    for (local_10 = *(long **)(in_RDI + 0x150); *local_10 != 0; local_10 = (long *)*local_10) {
      lVar1 = local_10[2];
      in_stack_ffffffffffffffd7 = ' ';
      if ((*(ushort *)(local_10 + 0x10) & 0x8000) == 0) {
        if (*(char *)(lVar1 + 0x39) == '\b') {
          fprintf(*(FILE **)(in_RDI + 0xa8),"  %s (%s):",*(undefined8 *)(lVar1 + 0x10),local_10[3]);
        }
        else {
          fprintf(*(FILE **)(in_RDI + 0xa8),"  %s:",local_10[3]);
        }
        if (*(char *)(lVar1 + 0x39) != '\x04') {
          for (local_20 = *(long **)(in_RDI + 0x1d8); *local_20 != 0; local_20 = (long *)*local_20)
          {
            for (local_18 = (long *)local_20[0xd]; *local_18 != 0; local_18 = (long *)*local_18) {
              if ((((long *)local_18[2] == local_10) &&
                  (iVar2 = strcmp((char *)local_18[4],*(char **)(in_RDI + 0x238)), iVar2 != 0)) &&
                 (iVar2 = strcmp((char *)local_18[4],*(char **)(in_RDI + 0x240)), iVar2 != 0)) {
                fprintf(*(FILE **)(in_RDI + 0xa8),"%c %s %lx(%lx)",
                        (ulong)(uint)(int)in_stack_ffffffffffffffd7,local_18[4],local_18[7],
                        local_18[10]);
                in_stack_ffffffffffffffd7 = ',';
              }
            }
          }
        }
        if (in_stack_ffffffffffffffd7 == ',') {
          fprintf(*(FILE **)(in_RDI + 0xa8)," hex\n");
        }
        else {
          fprintf(*(FILE **)(in_RDI + 0xa8),"  symbols only\n");
        }
      }
    }
    fprintf(*(FILE **)(in_RDI + 0xa8),"\n\nSection mapping (numbers in hex):\n");
    for (local_20 = *(long **)(in_RDI + 0x1d8); *local_20 != 0; local_20 = (long *)*local_20) {
      if (((local_20[10] != 0) || (*(long *)local_20[0x11] != 0)) ||
         ((*(long *)local_20[0x17] != 0 || ((*(ushort *)(local_20 + 5) & 2) != 0)))) {
        fprintf(*(FILE **)(in_RDI + 0xa8),"------------------------------\n  %08lx %s  (size %lx",
                local_20[8],local_20[3],local_20[10]);
        if ((ulong)local_20[0xb] < (ulong)local_20[10]) {
          fprintf(*(FILE **)(in_RDI + 0xa8),", allocated %lx",local_20[0xb]);
        }
        fprintf(*(FILE **)(in_RDI + 0xa8),")\n");
        for (local_18 = (long *)local_20[0xd]; *local_18 != 0; local_18 = (long *)*local_18) {
          if ((local_18[2] != 0) &&
             (bVar3 = is_ld_script((ObjectUnit *)
                                   CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0)),
             bVar3 == 0)) {
            fprintf(*(FILE **)(in_RDI + 0xa8),"           %08lx - %08lx %s(%s)\n",local_18[7],
                    local_18[7] + local_18[10],*(undefined8 *)(local_18[2] + 0x18),local_18[4]);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void linker_mapfile(struct GlobalVars *gv)
/* print section mapping, when desired */
{
  if (gv->map_file) {
    struct ObjectUnit *obj;
    struct Section *sec;
    struct LinkedSection *ls;

    /* print file names and the new addresses of their sections */
    fprintf(gv->map_file,"\nFiles:\n");

    for (obj=(struct ObjectUnit *)gv->selobjects.first;
         obj->n.next!=NULL; obj=(struct ObjectUnit *)obj->n.next) {
      struct LinkFile *lfile = obj->lnkfile;
      char sep = ' ';

      if (!(obj->flags & OUF_SCRIPT)) {
        if (lfile->type == ID_LIBARCH)
          fprintf(gv->map_file,"  %s (%s):",lfile->pathname,obj->objname);
        else
          fprintf(gv->map_file,"  %s:",obj->objname);

        if (lfile->type != ID_SHAREDOBJ) {
          for (ls=(struct LinkedSection *)gv->lnksec.first;
               ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
            for (sec=(struct Section *)ls->sections.first;
                 sec->n.next!=NULL; sec=(struct Section *)sec->n.next) {
              if (sec->obj == obj) {  /* section came from this object? */
                if (strcmp(sec->name,gv->common_sec_name) &&
                    strcmp(sec->name,gv->scommon_sec_name)) {
                  fprintf(gv->map_file,"%c %s %lx(%lx)",sep,sec->name,
                          sec->va,sec->size);
                  sep = ',';
                }
              }
            }
          }
        }

        if (sep == ',')  /* any sections listed? */
          fprintf(gv->map_file," hex\n");
        else
          fprintf(gv->map_file,"  symbols only\n"); /* empty or shared obj. */
      }
    }

    /* print section mappings */
    fprintf(gv->map_file,"\n\nSection mapping (numbers in hex):\n");

    for (ls=(struct LinkedSection *)gv->lnksec.first;
         ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
      if (!(ls->size==0 && listempty(&ls->relocs) &&
            listempty(&ls->symbols) && !(ls->ld_flags & LSF_PRESERVE))) {
        fprintf(gv->map_file,"------------------------------\n"
                "  %08lx %s  (size %lx",ls->copybase,ls->name,ls->size);
        if (ls->filesize < ls->size)
          fprintf(gv->map_file,", allocated %lx",ls->filesize);
        fprintf(gv->map_file,")\n");
  
        for (sec=(struct Section *)ls->sections.first;
             sec->n.next!=NULL; sec=(struct Section *)sec->n.next) {
          if (sec->obj!=NULL && !is_ld_script(sec->obj)) {
            fprintf(gv->map_file,"           %08lx - %08lx %s(%s)\n",
                    sec->va,sec->va+sec->size,sec->obj->objname,sec->name);
          }
        }
      }
    }
  }
}